

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi_is_16_bit(char *filename)

{
  int iVar1;
  FILE *__stream;
  long in_FS_OFFSET;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    *(char **)(in_FS_OFFSET + -0x20) = "can\'t fopen";
    iVar1 = 0;
  }
  else {
    iVar1 = stbi_is_16_bit_from_file((FILE *)__stream);
    fclose(__stream);
  }
  return iVar1;
}

Assistant:

STBIDEF int stbi_is_16_bit(char const *filename)
{
    FILE *f = stbi__fopen(filename, "rb");
    int result;
    if (!f) return stbi__err("can't fopen", "Unable to open file");
    result = stbi_is_16_bit_from_file(f);
    fclose(f);
    return result;
}